

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab)

{
  int iVar1;
  long lVar2;
  ExprList_item *pEVar3;
  Walker local_40;
  
  if (p != (Expr *)0x0) {
    do {
      if ((p->flags >> 0xc & 1) == 0) break;
      if ((p->flags >> 0x12 & 1) == 0) {
        pEVar3 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar3 = ((p->x).pList)->a;
      }
      p = pEVar3->pExpr;
    } while (p != (Expr *)0x0);
  }
  do {
    if (p == (Expr *)0x0) {
LAB_00177452:
      local_40.xExprCallback = impliesNotNullRow;
      local_40.eCode = 0;
      local_40.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      local_40.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      if (p != (Expr *)0x0) {
        local_40.u.n = iTab;
        walkExpr(&local_40,p);
      }
      return (uint)local_40.eCode;
    }
    lVar2 = 0x10;
    if (p->op != '3') {
      if (p->op != ',') goto LAB_00177452;
      iVar1 = sqlite3ExprImpliesNonNullRow(p->pLeft,iTab);
      lVar2 = 0x18;
      if (iVar1 != 0) {
        return 1;
      }
    }
    p = *(Expr **)(&p->op + lVar2);
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab){
  Walker w;
  p = sqlite3ExprSkipCollate(p);
  while( p ){
    if( p->op==TK_NOTNULL ){
      p = p->pLeft;
    }else if( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab) ) return 1;
      p = p->pRight;
    }else{
      break;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}